

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmissionSystem::ClearEmitterBeams(EmissionSystem *this)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  
  pEVar1 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**(pEVar3->super_DataTypeBase)._vptr_DataTypeBase)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->m_vEmitterBeams).
    super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>.
    _M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  this->m_ui8SystemDataLength = '\x05';
  this->m_ui8NumberOfBeams = '\0';
  return;
}

Assistant:

void EmissionSystem::ClearEmitterBeams()
{
    m_vEmitterBeams.clear();
    m_ui8NumberOfBeams = 0;
    m_ui8SystemDataLength = EMISSION_SYSTEM_SIZE / 4;
}